

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void jx9HashmapUnlinkNode(jx9_hashmap_node *pNode)

{
  sxu32 *psVar1;
  jx9_hashmap *pjVar2;
  jx9_vm *pVm;
  jx9_hashmap_node *pjVar3;
  jx9_hashmap_node **ppjVar4;
  
  pjVar2 = pNode->pMap;
  if (pNode->pPrevCollide == (jx9_hashmap_node *)0x0) {
    ppjVar4 = pjVar2->apBucket + (pjVar2->nSize - 1 & pNode->nHash);
  }
  else {
    ppjVar4 = &pNode->pPrevCollide->pNextCollide;
  }
  pVm = pjVar2->pVm;
  *ppjVar4 = pNode->pNextCollide;
  if (pNode->pNextCollide != (jx9_hashmap_node *)0x0) {
    pNode->pNextCollide->pPrevCollide = pNode->pPrevCollide;
  }
  if (pjVar2->pFirst == pNode) {
    pjVar2->pFirst = pNode->pPrev;
  }
  if (pjVar2->pCur == pNode) {
    pjVar2->pCur = pjVar2->pCur->pPrev;
  }
  if (pjVar2->pLast == pNode) {
    pjVar2->pLast = pjVar2->pLast->pNext;
  }
  pjVar3 = pNode->pPrev;
  if (pjVar3 != (jx9_hashmap_node *)0x0) {
    pjVar3->pNext = pNode->pNext;
  }
  if (pNode->pNext != (jx9_hashmap_node *)0x0) {
    pNode->pNext->pPrev = pjVar3;
  }
  jx9VmUnsetMemObj(pVm,pNode->nValIdx);
  if (pNode->iType == 2) {
    SyBlobRelease(&(pNode->xKey).sKey);
  }
  SyMemBackendPoolFree(&pVm->sAllocator,pNode);
  psVar1 = &pjVar2->nEntry;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    SyMemBackendFree(&pVm->sAllocator,pjVar2->apBucket);
    pjVar2->pLast = (jx9_hashmap_node *)0x0;
    pjVar2->pCur = (jx9_hashmap_node *)0x0;
    pjVar2->apBucket = (jx9_hashmap_node **)0x0;
    pjVar2->pFirst = (jx9_hashmap_node *)0x0;
    pjVar2->nSize = 0;
  }
  return;
}

Assistant:

static void jx9HashmapUnlinkNode(jx9_hashmap_node *pNode)
{
	jx9_hashmap *pMap = pNode->pMap;
	jx9_vm *pVm = pMap->pVm;
	/* Unlink from the corresponding bucket */
	if( pNode->pPrevCollide == 0 ){
		pMap->apBucket[pNode->nHash & (pMap->nSize - 1)] = pNode->pNextCollide;
	}else{
		pNode->pPrevCollide->pNextCollide = pNode->pNextCollide;
	}
	if( pNode->pNextCollide ){
		pNode->pNextCollide->pPrevCollide = pNode->pPrevCollide;
	}
	if( pMap->pFirst == pNode ){
		pMap->pFirst = pNode->pPrev;
	}
	if( pMap->pCur == pNode ){
		/* Advance the node cursor */
		pMap->pCur = pMap->pCur->pPrev; /* Reverse link */
	}
	/* Unlink from the map list */
	MACRO_LD_REMOVE(pMap->pLast, pNode);
	/* Restore to the free list */
	jx9VmUnsetMemObj(pVm, pNode->nValIdx);	
	if( pNode->iType == HASHMAP_BLOB_NODE ){
		SyBlobRelease(&pNode->xKey.sKey);
	}
	SyMemBackendPoolFree(&pVm->sAllocator, pNode);
	pMap->nEntry--;
	if( pMap->nEntry < 1 ){
		/* Free the hash-bucket */
		SyMemBackendFree(&pVm->sAllocator, pMap->apBucket);
		pMap->apBucket = 0;
		pMap->nSize = 0;
		pMap->pFirst = pMap->pLast = pMap->pCur = 0;
	}
}